

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChQuaternion<double>>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
          *bVal)

{
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *pvVar1;
  pointer pCVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  size_t arraysize;
  ChQuaternion<double> element;
  char idname [20];
  size_type local_88;
  ChNameValue<chrono::ChQuaternion<double>_> local_80;
  ChQuaternion<double> local_68;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  pCVar2 = (pvVar1->
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (pvVar1->
    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_88);
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::resize
            (bVal->_value,local_88);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < local_88; uVar4 = uVar4 + 1) {
    sprintf(local_48,"%lu",uVar4);
    local_80._flags = '\0';
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    local_80._name = local_48;
    local_80._value = &local_68;
    in<chrono::ChQuaternion<double>>(this,&local_80);
    ChQuaternion<double>::operator=
              ((ChQuaternion<double> *)
               ((long)((bVal->_value->
                       super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar3),&local_68);
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    lVar3 = lVar3 + 0x20;
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }